

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O1

VectorXd __thiscall Util::StdVec2Eigen(Util *this,vector<double,_std::allocator<double>_> *vec1)

{
  pointer pdVar1;
  pointer pdVar2;
  void *pvVar3;
  undefined8 *puVar4;
  ulong in_RDX;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  uint uVar5;
  long lVar6;
  VectorXd VVar7;
  
  pdVar1 = (vec1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar2 = (vec1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  uVar5 = (uint)((ulong)((long)pdVar1 - (long)pdVar2) >> 3);
  lVar6 = (long)(int)uVar5;
  if (*(long *)(this + 8) != lVar6) {
    free(*(void **)this);
    if ((int)uVar5 < 1) {
      pvVar3 = (void *)0x0;
      in_RDX = extraout_RDX;
    }
    else {
      pvVar3 = malloc(lVar6 * 8);
      in_RDX = extraout_RDX_00;
      if (pvVar3 == (void *)0x0) {
        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar4 = std::ios::widen;
        __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
    *(void **)this = pvVar3;
  }
  *(long *)(this + 8) = lVar6;
  if (0 < (int)uVar5) {
    pdVar1 = (vec1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = *(long *)this;
    in_RDX = 0;
    do {
      *(double *)(lVar6 + in_RDX * 8) = pdVar1[in_RDX];
      in_RDX = in_RDX + 1;
    } while ((uVar5 & 0x7fffffff) != in_RDX);
  }
  VVar7.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = in_RDX;
  VVar7.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (VectorXd)VVar7.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXd StdVec2Eigen(std::vector<double> vec1){

		//locals
		int n = vec1.size();
		Eigen::VectorXd vec2(n);

		//loop
		for (int ii = 0; ii < n; ++ii){
			vec2[ii] = vec1[ii];
		}

		//output
		return vec2;

	}